

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_format_pixels_to_normalized
                (void *src,rf_int src_size,rf_uncompressed_pixel_format src_format,rf_vec4 *dst,
                rf_int dst_size)

{
  byte bVar1;
  ushort uVar2;
  rf_source_location source_location;
  int iVar3;
  long lVar4;
  long *in_FS_OFFSET;
  float fVar5;
  float local_160;
  undefined4 uStack_134;
  rf_int src_iter_9;
  rf_int dst_iter_9;
  rf_int src_iter_8;
  rf_int dst_iter_8;
  rf_int src_iter_7;
  rf_int dst_iter_7;
  rf_int src_iter_6;
  rf_int dst_iter_6;
  rf_int src_iter_5;
  rf_int dst_iter_5;
  long lStack_c0;
  unsigned_short pixel_2;
  rf_int src_iter_4;
  rf_int dst_iter_4;
  long lStack_a8;
  unsigned_short pixel_1;
  rf_int src_iter_3;
  rf_int dst_iter_3;
  long lStack_90;
  unsigned_short pixel;
  rf_int src_iter_2;
  rf_int dst_iter_2;
  float value1;
  float value0;
  rf_int src_iter_1;
  rf_int dst_iter_1;
  long lStack_60;
  float value;
  rf_int src_iter;
  rf_int dst_iter;
  rf_int dst_pixel_count;
  rf_int src_pixel_count;
  rf_int src_bpp;
  _Bool success;
  rf_int dst_size_local;
  rf_vec4 *dst_local;
  rf_uncompressed_pixel_format src_format_local;
  rf_int src_size_local;
  void *src_local;
  
  src_bpp._7_1_ = false;
  iVar3 = rf_bytes_per_pixel(src_format);
  lVar4 = (long)iVar3;
  if ((long)((ulong)dst_size >> 4) < src_size / lVar4) {
    source_location.proc_name = "rf_format_pixels_to_normalized";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x32d;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Buffer is size %d but function expected a size of at least %d.",4,dst_size,
                src_size / lVar4 << 4,"rf_format_pixels_to_normalized");
    lVar4 = *in_FS_OFFSET;
    *(char **)(lVar4 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar4 + -0x458) = "rf_format_pixels_to_normalized";
    *(undefined8 *)(lVar4 + -0x450) = 0x32d;
    *(ulong *)(lVar4 + -0x448) = CONCAT44(uStack_134,4);
  }
  else {
    if (src_format == RF_UNCOMPRESSED_NORMALIZED) {
      memcpy(dst,src,src_size);
    }
    else {
      switch(src_format) {
      case RF_UNCOMPRESSED_GRAYSCALE:
        src_iter = 0;
        for (lStack_60 = 0; lStack_60 < src_size && src_iter < dst_size;
            lStack_60 = lVar4 + lStack_60) {
          fVar5 = (float)*(byte *)((long)src + lStack_60) / 255.0;
          dst[src_iter].x = fVar5;
          dst[src_iter].y = fVar5;
          dst[src_iter].z = fVar5;
          dst[src_iter].w = 1.0;
          src_iter = src_iter + 1;
        }
        break;
      case RF_UNCOMPRESSED_GRAY_ALPHA:
        src_iter_1 = 0;
        for (_value1 = 0; _value1 < src_size && src_iter_1 < dst_size; _value1 = lVar4 + _value1) {
          fVar5 = (float)*(byte *)((long)src + _value1) / 255.0;
          bVar1 = *(byte *)(_value1 + 1 + (long)src);
          dst[src_iter_1].x = fVar5;
          dst[src_iter_1].y = fVar5;
          dst[src_iter_1].z = fVar5;
          dst[src_iter_1].w = (float)bVar1 / 255.0;
          src_iter_1 = src_iter_1 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R5G6B5:
        src_iter_3 = 0;
        for (lStack_a8 = 0; lStack_a8 < src_size && src_iter_3 < dst_size;
            lStack_a8 = lVar4 + lStack_a8) {
          uVar2 = *(ushort *)((long)src + lStack_a8 * 2);
          dst[src_iter_3].x = (float)((int)(uVar2 & 0xf800) >> 0xb) * 0.032258064;
          dst[src_iter_3].y = (float)((int)(uVar2 & 0x7e0) >> 5) * 0.015873017;
          dst[src_iter_3].z = (float)(uVar2 & 0x1f) * 0.032258064;
          dst[src_iter_3].w = 1.0;
          src_iter_3 = src_iter_3 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R8G8B8:
        src_iter_6 = 0;
        for (dst_iter_7 = 0; dst_iter_7 < src_size && src_iter_6 < dst_size;
            dst_iter_7 = lVar4 + dst_iter_7) {
          dst[src_iter_6].x = (float)*(byte *)((long)src + dst_iter_7) / 255.0;
          dst[src_iter_6].y = (float)*(byte *)(dst_iter_7 + 1 + (long)src) / 255.0;
          dst[src_iter_6].z = (float)*(byte *)(dst_iter_7 + 2 + (long)src) / 255.0;
          dst[src_iter_6].w = 1.0;
          src_iter_6 = src_iter_6 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R5G5B5A1:
        src_iter_2 = 0;
        for (lStack_90 = 0; lStack_90 < src_size && src_iter_2 < dst_size;
            lStack_90 = lVar4 + lStack_90) {
          uVar2 = *(ushort *)((long)src + lStack_90 * 2);
          dst[src_iter_2].x = (float)((int)(uVar2 & 0xf800) >> 0xb) * 0.032258064;
          dst[src_iter_2].y = (float)((int)(uVar2 & 0x7c0) >> 6) * 0.032258064;
          dst[src_iter_2].z = (float)((int)(uVar2 & 0x3e) >> 1) * 0.032258064;
          local_160 = 0.0;
          if ((uVar2 & 1) != 0) {
            local_160 = 1.0;
          }
          dst[src_iter_2].w = local_160;
          src_iter_2 = src_iter_2 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R4G4B4A4:
        src_iter_4 = 0;
        for (lStack_c0 = 0; lStack_c0 < src_size && src_iter_4 < dst_size;
            lStack_c0 = lVar4 + lStack_c0) {
          uVar2 = *(ushort *)((long)src + lStack_c0 * 2);
          dst[src_iter_4].x = (float)((int)(uVar2 & 0xf000) >> 0xc) * 0.06666667;
          dst[src_iter_4].y = (float)((int)(uVar2 & 0xf00) >> 8) * 0.06666667;
          dst[src_iter_4].z = (float)((int)(uVar2 & 0xf0) >> 4) * 0.06666667;
          dst[src_iter_4].w = (float)(uVar2 & 0xf) * 0.06666667;
          src_iter_4 = src_iter_4 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R8G8B8A8:
        src_iter_5 = 0;
        for (dst_iter_6 = 0; dst_iter_6 < src_size && src_iter_5 < dst_size;
            dst_iter_6 = lVar4 + dst_iter_6) {
          dst[src_iter_5].x = (float)*(byte *)((long)src + dst_iter_6) / 255.0;
          dst[src_iter_5].y = (float)*(byte *)(dst_iter_6 + 1 + (long)src) / 255.0;
          dst[src_iter_5].z = (float)*(byte *)(dst_iter_6 + 2 + (long)src) / 255.0;
          dst[src_iter_5].w = (float)*(byte *)(dst_iter_6 + 3 + (long)src) / 255.0;
          src_iter_5 = src_iter_5 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R32:
        src_iter_7 = 0;
        for (dst_iter_8 = 0; dst_iter_8 < src_size && src_iter_7 < dst_size;
            dst_iter_8 = lVar4 + dst_iter_8) {
          dst[src_iter_7].x = *(float *)((long)src + dst_iter_8 * 4);
          dst[src_iter_7].y = 0.0;
          dst[src_iter_7].z = 0.0;
          dst[src_iter_7].w = 1.0;
          src_iter_7 = src_iter_7 + 1;
        }
        break;
      case RF_UNCOMPRESSED_R32G32B32:
        src_iter_8 = 0;
        for (dst_iter_9 = 0; dst_iter_9 < src_size && src_iter_8 < dst_size;
            dst_iter_9 = lVar4 + dst_iter_9) {
          dst[src_iter_8].x = *(float *)((long)src + dst_iter_9 * 4);
          dst[src_iter_8].y = *(float *)((long)src + dst_iter_9 * 4 + 4);
          dst[src_iter_8].z = *(float *)((long)src + dst_iter_9 * 4 + 8);
          dst[src_iter_8].w = 1.0;
          src_iter_8 = src_iter_8 + 1;
        }
      }
    }
    src_bpp._7_1_ = true;
  }
  return src_bpp._7_1_;
}

Assistant:

RF_API bool rf_format_pixels_to_normalized(const void* src, rf_int src_size, rf_uncompressed_pixel_format src_format, rf_vec4* dst, rf_int dst_size)
{
    bool success = false;

    rf_int src_bpp = rf_bytes_per_pixel(src_format);
    rf_int src_pixel_count = src_size / src_bpp;
    rf_int dst_pixel_count = dst_size / sizeof(rf_vec4);

    if (dst_pixel_count >= src_pixel_count)
    {
        if (src_format == RF_UNCOMPRESSED_R32G32B32A32)
        {
            success = true;
            memcpy(dst, src, src_size);
        }
        else
        {
            success = true;

            #define RF_FOR_EACH_PIXEL for (rf_int dst_iter = 0, src_iter = 0; src_iter < src_size && dst_iter < dst_size; dst_iter++, src_iter += src_bpp)
            switch (src_format)
            {
                case RF_UNCOMPRESSED_GRAYSCALE:
                    RF_FOR_EACH_PIXEL
                    {
                        float value = ((unsigned char*)src)[src_iter] / 255.0f;

                        dst[dst_iter].x = value;
                        dst[dst_iter].y = value;
                        dst[dst_iter].z = value;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_GRAY_ALPHA:
                    RF_FOR_EACH_PIXEL
                    {
                        float value0 = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        float value1 = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;

                        dst[dst_iter].x = value0;
                        dst[dst_iter].y = value0;
                        dst[dst_iter].z = value0;
                        dst[dst_iter].w = value1;
                    }
                    break;

                case RF_UNCOMPRESSED_R5G5B5A1:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*) src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111100000000000) >> 11) * (1.0f/31);
                        dst[dst_iter].y = (float)((pixel & 0b0000011111000000) >>  6) * (1.0f/31);
                        dst[dst_iter].z = (float)((pixel & 0b0000000000111110) >>  1) * (1.0f/31);
                        dst[dst_iter].w = ((pixel & 0b0000000000000001) == 0) ? 0.0f : 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R5G6B5:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*)src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111100000000000) >> 11) * (1.0f / 31);
                        dst[dst_iter].y = (float)((pixel & 0b0000011111100000) >>  5) * (1.0f / 63);
                        dst[dst_iter].z = (float) (pixel & 0b0000000000011111)        * (1.0f / 31);
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R4G4B4A4:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*)src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111000000000000) >> 12) * (1.0f / 15);
                        dst[dst_iter].y = (float)((pixel & 0b0000111100000000) >> 8)  * (1.0f / 15);
                        dst[dst_iter].z = (float)((pixel & 0b0000000011110000) >> 4)  * (1.0f / 15);
                        dst[dst_iter].w = (float) (pixel & 0b0000000000001111)        * (1.0f / 15);
                    }
                    break;

                case RF_UNCOMPRESSED_R8G8B8A8:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        dst[dst_iter].y = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;
                        dst[dst_iter].z = (float)((unsigned char*)src)[src_iter + 2] / 255.0f;
                        dst[dst_iter].w = (float)((unsigned char*)src)[src_iter + 3] / 255.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R8G8B8:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        dst[dst_iter].y = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;
                        dst[dst_iter].z = (float)((unsigned char*)src)[src_iter + 2] / 255.0f;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter];
                        dst[dst_iter].y = 0.0f;
                        dst[dst_iter].z = 0.0f;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32G32B32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter + 0];
                        dst[dst_iter].y = ((float*)src)[src_iter + 1];
                        dst[dst_iter].z = ((float*)src)[src_iter + 2];
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32G32B32A32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter + 0];
                        dst[dst_iter].y = ((float*)src)[src_iter + 1];
                        dst[dst_iter].z = ((float*)src)[src_iter + 2];
                        dst[dst_iter].w = ((float*)src)[src_iter + 3];
                    }
                    break;

                default: break;
            }